

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void asl_16(void)

{
  ubyte uVar1;
  
  except = '\0';
  uVar1 = getbyte(pc);
  temp2 = uVar1 + x_reg;
  carry_f = RAM[temp2] & 0x80;
  result_f = RAM[temp2] * '\x02';
  RAM[temp2] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void asl_16(void) {
    CLE;
    temp2 = (getbyte(pc) + (ubyte) x_reg);
    result_f = RAM[temp2];

    carry_f = result_f & 0x80;
    result_f <<= 1;

    RAM[temp2] = result_f;
    pc++;
}